

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLedgerEntry.cpp
# Opt level: O2

void __thiscall jbcoin::STLedgerEntry::STLedgerEntry(STLedgerEntry *this,Keylet *k)

{
  atomic<int> *paVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  Counter *pCVar5;
  Item *type;
  
  STObject::STObject(&this->super_STObject,(SField *)sfLedgerEntry);
  pCVar5 = CountedObject<jbcoin::STLedgerEntry>::getCounter();
  LOCK();
  paVar1 = &(pCVar5->super_CounterBase).m_count;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
  UNLOCK();
  (this->super_STObject).super_STBase._vptr_STBase = (_func_int **)&PTR__STLedgerEntry_002f81a0;
  uVar2 = *(undefined8 *)((k->key).pn + 2);
  uVar3 = *(undefined8 *)((k->key).pn + 4);
  uVar4 = *(undefined8 *)((k->key).pn + 6);
  *(undefined8 *)(this->key_).pn = *(undefined8 *)(k->key).pn;
  *(undefined8 *)((this->key_).pn + 2) = uVar2;
  *(undefined8 *)((this->key_).pn + 4) = uVar3;
  *(undefined8 *)((this->key_).pn + 6) = uVar4;
  this->type_ = k->type;
  LedgerFormats::getInstance();
  type = KnownFormats<jbcoin::LedgerEntryType>::findByType
                   (&LedgerFormats::getInstance::instance.
                     super_KnownFormats<jbcoin::LedgerEntryType>,this->type_);
  if (type != (Item *)0x0) {
    STObject::set(&this->super_STObject,&type->elements);
    STObject::setFieldUsingSetValue<jbcoin::STInteger<unsigned_short>,unsigned_short>
              (&this->super_STObject,(SField *)&sfLedgerEntryType,(short)this->type_);
    return;
  }
  Throw<std::runtime_error,char_const(&)[26]>((char (*) [26])"invalid ledger entry type");
}

Assistant:

STLedgerEntry::STLedgerEntry (Keylet const& k)
    :  STObject(sfLedgerEntry)
    , key_ (k.key)
    , type_ (k.type)
{
    auto const format =
        LedgerFormats::getInstance().findByType (type_);

    if (format == nullptr)
        Throw<std::runtime_error> ("invalid ledger entry type");

    set (format->elements);

    setFieldU16 (sfLedgerEntryType,
        static_cast <std::uint16_t> (type_));
}